

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall icu_63::Calendar::validateFields(Calendar *this,UErrorCode *status)

{
  ulong uVar1;
  bool bVar2;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  uVar1 = 0;
  do {
    if (1 < this->fStamp[uVar1]) {
      (*(this->super_UObject)._vptr_UObject[0x27])(this,uVar1 & 0xffffffff,status);
    }
  } while ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (bVar2 = uVar1 < 0x16, uVar1 = uVar1 + 1, bVar2))
  ;
  return;
}

Assistant:

static
    inline UBool U_SUCCESS(UErrorCode code) { return (UBool)(code<=U_ZERO_ERROR); }